

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ExtensionGenerator::Generate
          (ExtensionGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Descriptor *pDVar2;
  undefined1 local_48 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  Printer *printer_local;
  ExtensionGenerator *this_local;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_48);
  InitTemplateVars(this->descriptor_,&this->scope_,
                   (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_48);
  io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_48,"public static final int $constant_name$ = $number$;\n");
  WriteFieldDocComment
            ((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,this->descriptor_);
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = HasDescriptorMethods(descriptor);
  if (bVar1) {
    pDVar2 = FieldDescriptor::extension_scope(this->descriptor_);
    if (pDVar2 == (Descriptor *)0x0) {
      io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_48,
                         "public static final\n  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessage\n        .newFileScopedGeneratedExtension(\n      $singular_type$.class,\n      $prototype$);\n"
                        );
    }
    else {
      io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_48,
                         "public static final\n  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessage\n        .newMessageScopedGeneratedExtension(\n      $scope$.getDefaultInstance(),\n      $index$,\n      $singular_type$.class,\n      $prototype$);\n"
                        );
    }
  }
  else {
    bVar1 = FieldDescriptor::is_repeated(this->descriptor_);
    if (bVar1) {
      io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_48,
                         "public static final\n  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n        .newRepeatedGeneratedExtension(\n      $containing_type$.getDefaultInstance(),\n      $prototype$,\n      $enum_map$,\n      $number$,\n      com.google.protobuf.WireFormat.FieldType.$type_constant$,\n      $packed$);\n"
                        );
    }
    else {
      io::Printer::Print((Printer *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_48,
                         "public static final\n  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n    $containing_type$,\n    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n        .newSingularGeneratedExtension(\n      $containing_type$.getDefaultInstance(),\n      $default$,\n      $prototype$,\n      $enum_map$,\n      $number$,\n      com.google.protobuf.WireFormat.FieldType.$type_constant$);\n"
                        );
    }
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_48);
  return;
}

Assistant:

void ExtensionGenerator::Generate(io::Printer* printer) {
  map<string, string> vars;
  InitTemplateVars(descriptor_, scope_, &vars);
  printer->Print(vars,
      "public static final int $constant_name$ = $number$;\n");

  WriteFieldDocComment(printer, descriptor_);
  if (HasDescriptorMethods(descriptor_->file())) {
    // Non-lite extensions
    if (descriptor_->extension_scope() == NULL) {
      // Non-nested
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessage\n"
          "        .newFileScopedGeneratedExtension(\n"
          "      $singular_type$.class,\n"
          "      $prototype$);\n");
    } else {
      // Nested
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessage.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessage\n"
          "        .newMessageScopedGeneratedExtension(\n"
          "      $scope$.getDefaultInstance(),\n"
          "      $index$,\n"
          "      $singular_type$.class,\n"
          "      $prototype$);\n");
    }
  } else {
    // Lite extensions
    if (descriptor_->is_repeated()) {
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n"
          "        .newRepeatedGeneratedExtension(\n"
          "      $containing_type$.getDefaultInstance(),\n"
          "      $prototype$,\n"
          "      $enum_map$,\n"
          "      $number$,\n"
          "      com.google.protobuf.WireFormat.FieldType.$type_constant$,\n"
          "      $packed$);\n");
    } else {
      printer->Print(
          vars,
          "public static final\n"
          "  com.google.protobuf.GeneratedMessageLite.GeneratedExtension<\n"
          "    $containing_type$,\n"
          "    $type$> $name$ = com.google.protobuf.GeneratedMessageLite\n"
          "        .newSingularGeneratedExtension(\n"
          "      $containing_type$.getDefaultInstance(),\n"
          "      $default$,\n"
          "      $prototype$,\n"
          "      $enum_map$,\n"
          "      $number$,\n"
          "      com.google.protobuf.WireFormat.FieldType.$type_constant$);\n");
    }
  }
}